

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceGLImpl::CreateFramebuffer
          (RenderDeviceGLImpl *this,FramebufferDesc *Desc,IFramebuffer **ppFramebuffer)

{
  anon_class_32_4_88180df4 ConstructObject;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  string msg;
  undefined1 local_50 [16];
  FramebufferDesc *pFStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  RefCntAutoPtr<Diligent::RenderDeviceGLImpl> local_28;
  RefCntAutoPtr<Diligent::BufferGLImpl> local_20;
  
  if ((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_50._0_8_ = (DeviceContextGLImpl *)0x0;
  }
  else {
    RefCntWeakPtr<Diligent::DeviceContextGLImpl>::Lock
              ((RefCntWeakPtr<Diligent::DeviceContextGLImpl> *)local_50);
  }
  if ((DeviceContextGLImpl *)local_50._0_8_ == (DeviceContextGLImpl *)0x0) {
    FormatString<char[44]>
              ((string *)(local_50 + 8),(char (*) [44])"Immediate device context has been destroyed"
              );
    DebugAssertionFailed
              ((Char *)local_50._8_8_,"CreateFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._8_8_ != &local_38) {
      operator_delete((void *)local_50._8_8_,local_38._M_allocated_capacity + 1);
    }
  }
  local_28.m_pObject = (RenderDeviceGLImpl *)(local_50._0_8_ + 0x750);
  local_38._M_allocated_capacity = (size_type)&local_28;
  local_38._8_8_ = &local_20;
  ConstructObject.Desc = Desc;
  ConstructObject.this = &this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>;
  ConstructObject.ExtraArgs =
       (reference_wrapper<Diligent::GLContextState> *)local_38._M_allocated_capacity;
  ConstructObject.ppFramebuffer = (IFramebuffer ***)local_38._8_8_;
  local_50._8_8_ = this;
  pFStack_40 = Desc;
  local_20.m_pObject = (BufferGLImpl *)ppFramebuffer;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateDeviceObject<Diligent::IFramebuffer,Diligent::FramebufferDesc,Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::CreateFramebufferImpl<std::reference_wrapper<Diligent::GLContextState>>(Diligent::IFramebuffer**,Diligent::FramebufferDesc_const&,std::reference_wrapper<Diligent::GLContextState>const&)::_lambda()_1_>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,"Framebuffer",Desc,
             ppFramebuffer,ConstructObject);
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)local_50);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateFramebuffer(const FramebufferDesc& Desc, IFramebuffer** ppFramebuffer)
{
    auto pDeviceContext = GetImmediateContext(0);
    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
    auto& GLState = pDeviceContext->GetContextState();

    CreateFramebufferImpl(ppFramebuffer, Desc, std::ref(GLState));
}